

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

MemPage * btreePageLookup(BtShared *pBt,Pgno pgno)

{
  DbPage *pDVar1;
  MemPage *pMVar2;
  u8 uVar3;
  
  pDVar1 = sqlite3PagerLookup(pBt->pPager,pgno);
  if (pDVar1 == (DbPage *)0x0) {
    pMVar2 = (MemPage *)0x0;
  }
  else {
    pMVar2 = (MemPage *)pDVar1->pExtra;
    if (pMVar2->pgno != pgno) {
      pMVar2->aData = (u8 *)pDVar1->pData;
      pMVar2->pDbPage = pDVar1;
      pMVar2->pBt = pBt;
      pMVar2->pgno = pgno;
      uVar3 = 'd';
      if (pgno != 1) {
        uVar3 = '\0';
      }
      pMVar2->hdrOffset = uVar3;
    }
  }
  return pMVar2;
}

Assistant:

static MemPage *btreePageLookup(BtShared *pBt, Pgno pgno){
  DbPage *pDbPage;
  assert( sqlite3_mutex_held(pBt->mutex) );
  pDbPage = sqlite3PagerLookup(pBt->pPager, pgno);
  if( pDbPage ){
    return btreePageFromDbPage(pDbPage, pgno, pBt);
  }
  return 0;
}